

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall Minisat::ClauseAllocator::reloc(ClauseAllocator *this,CRef *cr,ClauseAllocator *to)

{
  bool bVar1;
  CRef CVar2;
  Clause *this_00;
  Clause *in_RDX;
  ClauseAllocator *in_RSI;
  Clause *c;
  CRef in_stack_ffffffffffffffdc;
  ClauseAllocator *in_stack_ffffffffffffffe0;
  
  this_00 = operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  bVar1 = Clause::reloced(this_00);
  if (bVar1) {
    CVar2 = Clause::relocation(this_00);
    *(CRef *)&(in_RSI->ra).memory = CVar2;
  }
  else {
    CVar2 = alloc(in_RSI,in_RDX);
    *(CRef *)&(in_RSI->ra).memory = CVar2;
    Clause::relocate(this_00,*(CRef *)&(in_RSI->ra).memory);
  }
  return;
}

Assistant:

void reloc(CRef& cr, ClauseAllocator& to)
    {
        Clause& c = operator[](cr);
        
        if (c.reloced()) { cr = c.relocation(); return; }
        
        cr = to.alloc(c);
        c.relocate(cr);
    }